

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
floatFromString(Expected<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  char *endptr;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  char *local_18;
  
  local_18 = (char *)0x0;
  fVar2 = strtof((s->_M_dataplus)._M_p,&local_18);
  if ((s->_M_string_length == 0) || (*local_18 != '\0')) {
    format_abi_cxx11_(&local_58,"Cannot convert \'%s\' to float",(s->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      local_28._8_8_ = local_58.field_2._8_8_;
      local_38 = &local_28;
    }
    else {
      local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_58._M_dataplus._M_p;
    }
    local_28._M_allocated_capacity._1_7_ = local_58.field_2._M_allocated_capacity._1_7_;
    local_28._M_local_buf[0] = local_58.field_2._M_local_buf[0];
    paVar1 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar1;
    if (local_38 == &local_28) {
      paVar1->_M_allocated_capacity = local_28._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           local_28._8_8_;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_38;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_28._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_58._M_string_length;
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    (__return_storage_ptr__->field_0).value_ = fVar2;
    __return_storage_ptr__->has_value_ = true;
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<float, std::string> floatFromString(const std::string &s) {
		char *endptr = nullptr;
		const float ret = strtof(s.c_str(), &endptr);
		if (s.empty() || endptr[0] != '\0')
			return Unexpected(format("Cannot convert '%s' to float", s.c_str()));
		return ret;
}